

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeCommitPhaseTwo(Btree *p,int bCleanup)

{
  int *piVar1;
  BtShared *pBVar2;
  Pager *pPager;
  u8 uVar3;
  uint uVar4;
  sqlite3_mutex *psVar5;
  
  if (p->inTrans == '\0') {
    return 0;
  }
  sqlite3BtreeEnter(p);
  if (p->inTrans == '\x02') {
    pBVar2 = p->pBt;
    pPager = pBVar2->pPager;
    uVar4 = pPager->errCode;
    if (uVar4 == 0) {
      if (((pPager->eState == '\x02') && (pPager->exclusiveMode != '\0')) &&
         (pPager->journalMode == '\x01')) {
        uVar4 = 0;
        uVar3 = '\x01';
      }
      else {
        uVar4 = pager_end_transaction(pPager,(uint)pPager->setMaster,1);
        if (((char)uVar4 != '\r') && ((uVar4 & 0xff) != 10)) goto LAB_0014bd8f;
        pPager->errCode = uVar4;
        uVar3 = '\x06';
      }
      pPager->eState = uVar3;
    }
LAB_0014bd8f:
    if ((bCleanup == 0) && (uVar4 != 0)) {
      if (p->sharable == '\0') {
        return uVar4;
      }
      piVar1 = &p->wantToLock;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 != 0) {
        return uVar4;
      }
      psVar5 = p->pBt->mutex;
      goto LAB_0014bde2;
    }
    pBVar2->inTransaction = '\x01';
    sqlite3BitvecDestroy(pBVar2->pHasContent);
    pBVar2->pHasContent = (Bitvec *)0x0;
  }
  btreeEndTransaction(p);
  if (p->sharable == '\0') {
    return 0;
  }
  piVar1 = &p->wantToLock;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    return 0;
  }
  psVar5 = p->pBt->mutex;
  uVar4 = 0;
LAB_0014bde2:
  if (psVar5 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar5);
  }
  p->locked = '\0';
  return uVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCommitPhaseTwo(Btree *p, int bCleanup){

  if( p->inTrans==TRANS_NONE ) return SQLITE_OK;
  sqlite3BtreeEnter(p);
  btreeIntegrity(p);

  /* If the handle has a write-transaction open, commit the shared-btrees 
  ** transaction and set the shared state to TRANS_READ.
  */
  if( p->inTrans==TRANS_WRITE ){
    int rc;
    BtShared *pBt = p->pBt;
    assert( pBt->inTransaction==TRANS_WRITE );
    assert( pBt->nTransaction>0 );
    rc = sqlite3PagerCommitPhaseTwo(pBt->pPager);
    if( rc!=SQLITE_OK && bCleanup==0 ){
      sqlite3BtreeLeave(p);
      return rc;
    }
    pBt->inTransaction = TRANS_READ;
    btreeClearHasContent(pBt);
  }

  btreeEndTransaction(p);
  sqlite3BtreeLeave(p);
  return SQLITE_OK;
}